

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O0

void saisxx_private::
     induceSA<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
               (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> T,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C,
               __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B,long n,long k)

{
  bool bVar1;
  reference plVar2;
  ulong *puVar3;
  ulong uVar4;
  difference_type dVar5;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *this;
  ulong local_110;
  ulong local_f8;
  ulong local_d8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_a0;
  long *local_98;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_90;
  long *local_88;
  long local_80;
  long *local_78;
  long *local_70;
  long *local_68;
  long local_60;
  char_type c1;
  char_type c0;
  long j;
  long i;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> b;
  long k_local;
  long n_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> B_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> C_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> SA_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> T_local;
  
  b._M_current = (long *)k;
  n_local = (long)B._M_current;
  B_local = C;
  C_local = SA;
  SA_local = T;
  __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::__normal_iterator
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i);
  bVar1 = __gnu_cxx::operator==
                    (&B_local,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)&n_local);
  if (bVar1) {
    local_68 = SA_local._M_current;
    local_70 = B_local._M_current;
    getCounts<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (SA_local,B_local,n,(long)b._M_current);
  }
  local_78 = B_local._M_current;
  local_80 = n_local;
  getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
            (B_local,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)n_local,
             (long)b._M_current,false);
  c0 = n + -1;
  plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
           operator[](&SA_local,c0);
  local_60 = *plVar2;
  plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
           operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                      &n_local,local_60);
  local_88 = (long *)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                     ::operator+(&C_local,*plVar2);
  i = (long)local_88;
  if ((c0 < 1) ||
     (plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&SA_local,c0 + -1), local_60 <= *plVar2)) {
    local_d8 = c0;
  }
  else {
    local_d8 = c0 ^ 0xffffffffffffffff;
  }
  local_90 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator++((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i,0
                       );
  puVar3 = (ulong *)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                    ::operator*(&local_90);
  *puVar3 = local_d8;
  for (j = 0; j < n; j = j + 1) {
    puVar3 = (ulong *)__gnu_cxx::
                      __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                      operator[](&C_local,j);
    c0 = *puVar3;
    uVar4 = c0 ^ 0xffffffffffffffff;
    puVar3 = (ulong *)__gnu_cxx::
                      __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                      operator[](&C_local,j);
    *puVar3 = uVar4;
    if (0 < c0) {
      c0 = c0 + -1;
      plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&SA_local,c0);
      c1 = *plVar2;
      if (c1 != local_60) {
        dVar5 = __gnu_cxx::operator-
                          ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &i,&C_local);
        plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &n_local,local_60);
        *plVar2 = dVar5;
        local_60 = c1;
        plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &n_local,c1);
        local_98 = (long *)__gnu_cxx::
                           __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                           operator+(&C_local,*plVar2);
        i = (long)local_98;
      }
      if ((c0 < 1) ||
         (plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator[](&SA_local,c0 + -1), local_60 <= *plVar2)) {
        local_f8 = c0;
      }
      else {
        local_f8 = c0 ^ 0xffffffffffffffff;
      }
      local_a0 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator++((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &i,0);
      puVar3 = (ulong *)__gnu_cxx::
                        __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                        operator*(&local_a0);
      *puVar3 = local_f8;
    }
  }
  bVar1 = __gnu_cxx::operator==
                    (&B_local,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                               *)&n_local);
  if (bVar1) {
    getCounts<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
              (SA_local,B_local,n,(long)b._M_current);
  }
  getBuckets<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
            (B_local,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)n_local,
             (long)b._M_current,true);
  j = n + -1;
  local_60 = 0;
  plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
           operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                      &n_local,0);
  i = (long)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
            operator+(&C_local,*plVar2);
  for (; -1 < j; j = j + -1) {
    puVar3 = (ulong *)__gnu_cxx::
                      __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                      operator[](&C_local,j);
    c0 = *puVar3;
    if (c0 < 1) {
      uVar4 = c0 ^ 0xffffffffffffffff;
      puVar3 = (ulong *)__gnu_cxx::
                        __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                        operator[](&C_local,j);
      *puVar3 = uVar4;
    }
    else {
      c0 = c0 - 1;
      plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator[](&SA_local,c0);
      c1 = *plVar2;
      if (c1 != local_60) {
        dVar5 = __gnu_cxx::operator-
                          ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                           &i,&C_local);
        plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &n_local,local_60);
        *plVar2 = dVar5;
        local_60 = c1;
        plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                 operator[]((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                            &n_local,c1);
        i = (long)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                  operator+(&C_local,*plVar2);
      }
      if ((c0 == 0) ||
         (plVar2 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                   operator[](&SA_local,c0 + -1), local_60 < *plVar2)) {
        local_110 = c0 ^ 0xffffffffffffffff;
      }
      else {
        local_110 = c0;
      }
      this = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
             operator--((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)&i);
      puVar3 = (ulong *)__gnu_cxx::
                        __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                        operator*(this);
      *puVar3 = local_110;
    }
  }
  return;
}

Assistant:

void
induceSA(string_type T, sarray_type SA, bucket_type C, bucket_type B,
         index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    j = SA[i], SA[i] = ~j;
    if(0 < j) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      if((c0 = T[--j]) != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((j == 0) || (T[j - 1] > c1)) ? ~j : j;
    } else {
      SA[i] = ~j;
    }
  }
}